

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_on_close(uv_handle_t *handle)

{
  ulong uVar1;
  uv_handle_t *__ptr;
  int64_t eval_b;
  int64_t eval_a;
  
  __ptr = (uv_handle_t *)handle->data;
  uVar1 = (ulong)*(uint *)((long)&__ptr->data + 4);
  if (uVar1 == 1000) {
    if ((uv_handle_t *)&__ptr->type != handle) {
      uv_close(&__ptr->type,ponger_on_close);
      __ptr = handle;
    }
    free(__ptr);
    completed_pingers = completed_pingers + 1;
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ping-pong.c"
          ,0x48,"1000","==","pinger->pongs",1000,"==",uVar1);
  abort();
}

Assistant:

static void pinger_on_close(uv_handle_t* handle) {
  pinger_t* pinger = (pinger_t*) handle->data;

  ASSERT_EQ(NUM_PINGS, pinger->pongs);

  if (handle == (uv_handle_t*) &pinger->stream.tcp) {
    free(pinger); /* also frees handle */
  } else {
    uv_close((uv_handle_t*) &pinger->stream.tcp, ponger_on_close);
    free(handle);
  }

  completed_pingers++;
}